

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O0

vmd_note_t * vmd_track_insert(vmd_track_t *track,vmd_time_t beg,vmd_time_t end,vmd_pitch_t pitch)

{
  vmd_channel_t *pvVar1;
  int value;
  vmd_note_t *note_00;
  vmd_note_t *note;
  vmd_note_t n;
  vmd_pitch_t pitch_local;
  vmd_time_t end_local;
  vmd_time_t beg_local;
  vmd_track_t *track_local;
  
  n.on_time._0_1_ = 0x40;
  n.on_time._1_1_ = 0x40;
  n.on_time._2_2_ = 0;
  n.off_time._0_1_ = 0;
  n.off_time._1_1_ = 0;
  note = (vmd_note_t *)track;
  n.track._0_4_ = beg;
  n.track._4_4_ = end;
  n.next._6_2_ = pitch;
  n._16_8_ = vmd_track_temp_channel(track,beg,end,(vmd_note_t *)0x0);
  n.channel = (vmd_channel_t *)0x0;
  note_00 = vmd_insert_note((vmd_note_t *)&note);
  vmd_note_reset_pitch(note_00,n.next._6_2_);
  pvVar1 = note_00->channel;
  value = vmd_track_get_ctrl(track,0x80);
  vmd_map_set_range(pvVar1->ctrl + 0x80,beg,end,value);
  return note_00;
}

Assistant:

note_t *
track_insert(track_t *track, time_t beg, time_t end, pitch_t pitch)
{
	note_t n = {
		.track = track,
		.channel = track_temp_channel(track, beg, end, NULL),

		.on_time = beg,
		.on_vel = DEFAULT_VELOCITY,

		.off_time = end,
		.off_vel = DEFAULT_VELOCITY,
	};

	note_t *note = insert_note(&n);
	note_reset_pitch(note, pitch);
	map_set_range(&note->channel->ctrl[CCTRL_PROGRAM], beg, end, track_get_ctrl(track, CCTRL_PROGRAM));
	return note;
}